

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::PrintValue<std::vector<int,std::allocator<int>>,void>
               (vector<int,_std::allocator<int>_> *container,ostream *os)

{
  int *piVar1;
  int *piVar2;
  bool bVar3;
  int *piVar4;
  long lVar5;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  piVar1 = (container->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (container->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != piVar2) {
    lVar5 = 0;
    do {
      piVar4 = piVar1 + 1;
      if (lVar5 == 0) {
LAB_001966a9:
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
        std::ostream::operator<<((ostream *)os,*piVar1);
        lVar5 = lVar5 + 1;
        bVar3 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
        if (lVar5 != 0x20) goto LAB_001966a9;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar5 = 0x20;
        bVar3 = true;
      }
    } while ((!bVar3) && (piVar1 = piVar4, piVar4 != piVar2));
    if (lVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }